

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_object.h
# Opt level: O1

strings * __thiscall
c74::min::object<TestObject,(c74::min::threadsafe)1>::tags_abi_cxx11_
          (strings *__return_storage_ptr__,void *this)

{
  pointer pbVar1;
  pointer pcVar2;
  strings *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_tag;
  pointer this_00;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,0,0);
  this_00 = (__return_storage_ptr__->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pbVar1) {
    do {
      if (this_00->_M_string_length == 0) {
        pcVar2 = (this_00->_M_dataplus)._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar2,pcVar2);
      }
      else {
        std::__cxx11::string::find_first_not_of((char)this_00,0x20);
        std::__cxx11::string::find_last_not_of((char)this_00,0x20);
        std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
      }
      std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual strings tags() const override
    {
        strings t;
        get_tags<min_class_type>(t);
        for (auto& a_tag : t) {
            a_tag = str::trim(a_tag);
        }
        return t;
    }